

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3.cpp
# Opt level: O0

int detect_yolov3(Mat *bgr,vector<Object,_std::allocator<Object>_> *objects)

{
  int iVar1;
  long in_RDI;
  Object object;
  float *values;
  int i;
  Mat out;
  Extractor ex;
  float norm_vals [3];
  float mean_vals [3];
  Mat in;
  int img_h;
  int img_w;
  int target_size;
  Net yolov3;
  float *in_stack_00000308;
  float *in_stack_00000310;
  Mat *in_stack_00000318;
  Net *this;
  Net *in_stack_fffffffffffffdb8;
  vector<Object,_std::allocator<Object>_> *in_stack_fffffffffffffdc0;
  Net *in_stack_fffffffffffffdc8;
  void **ppvVar2;
  Net *in_stack_fffffffffffffdd0;
  int type;
  Extractor *pEVar3;
  Mat *in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffde0;
  Extractor *in_stack_fffffffffffffde8;
  uint in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  int local_1d4;
  Extractor local_1d0;
  undefined8 local_1c0;
  undefined4 local_1b8;
  long *local_1b0;
  undefined4 local_1a8;
  undefined4 local_1a4;
  int local_1a0;
  undefined4 local_19c;
  undefined4 local_198;
  undefined8 local_190;
  undefined8 local_178;
  undefined4 local_170;
  undefined8 local_168;
  undefined4 local_160;
  void *local_158;
  int *local_150;
  long *local_138;
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 local_108;
  undefined1 local_d1;
  long local_a0;
  Extractor *local_98;
  int local_8c;
  Extractor *local_88;
  Extractor *local_80;
  void **local_70;
  int local_50;
  undefined4 local_4c;
  void **local_48;
  int local_30;
  undefined4 local_2c;
  Extractor *local_28;
  _func_int **local_20;
  
  local_a0 = in_RDI;
  ncnn::Net::Net(in_stack_fffffffffffffdd0);
  type = (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
  local_d1 = 1;
  iVar1 = ncnn::Net::load_param(in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
  if (iVar1 != 0) {
    exit(-1);
  }
  iVar1 = ncnn::Net::load_model(in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
  if (iVar1 == 0) {
    local_108 = 0x160;
    local_10c = *(undefined4 *)(local_a0 + 0xc);
    local_110 = *(undefined4 *)(local_a0 + 8);
    this = (Net *)0x0;
    ncnn::Mat::from_pixels_resize
              ((uchar *)(ulong)in_stack_fffffffffffffdf0,
               (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),(int)in_stack_fffffffffffffde8,
               (int)((ulong)in_stack_fffffffffffffde0 >> 0x20),(int)in_stack_fffffffffffffde0,
               in_stack_fffffffffffffe10,
               (Allocator *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    local_168 = 0x42ff000042ff0000;
    local_160 = 0x42ff0000;
    local_178 = 0x3c007fed3c007fed;
    local_170 = 0x3c007fed;
    ncnn::Mat::substract_mean_normalize(in_stack_00000318,in_stack_00000310,in_stack_00000308);
    ncnn::Net::create_extractor(in_stack_fffffffffffffdb8);
    ncnn::Extractor::input
              (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    local_98 = &local_1d0;
    local_1d0._vptr_Extractor = (_func_int **)0x0;
    local_1d0.d = (ExtractorPrivate *)0x0;
    local_1c0 = 0;
    local_1b8 = 0;
    local_1b0 = (long *)0x0;
    local_1a8 = 0;
    local_1a4 = 0;
    local_1a0 = 0;
    local_19c = 0;
    local_198 = 0;
    local_190 = 0;
    ncnn::Extractor::extract(local_98,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,type);
    std::vector<Object,_std::allocator<Object>_>::clear
              ((vector<Object,_std::allocator<Object>_> *)0x124d37);
    for (local_1d4 = 0; local_1d4 < local_1a0; local_1d4 = local_1d4 + 1) {
      local_88 = &local_1d0;
      local_8c = local_1d4;
      Object::Object((Object *)0x124db0);
      std::vector<Object,_std::allocator<Object>_>::push_back
                (in_stack_fffffffffffffdc0,(value_type *)in_stack_fffffffffffffdb8);
    }
    pEVar3 = &local_1d0;
    local_80 = pEVar3;
    local_28 = pEVar3;
    if (local_1d0.d != (ExtractorPrivate *)0x0) {
      local_2c = 0xffffffff;
      LOCK();
      local_30 = *(int *)&(local_1d0.d)->net;
      *(int *)&(local_1d0.d)->net = *(int *)&(local_1d0.d)->net + -1;
      UNLOCK();
      if (local_30 == 1) {
        if (local_1b0 == (long *)0x0) {
          local_20 = local_1d0._vptr_Extractor;
          if (local_1d0._vptr_Extractor != (_func_int **)0x0) {
            free(local_1d0._vptr_Extractor);
          }
        }
        else {
          (**(code **)(*local_1b0 + 0x18))(local_1b0,local_1d0._vptr_Extractor);
        }
      }
    }
    pEVar3->_vptr_Extractor = (_func_int **)0x0;
    pEVar3[1]._vptr_Extractor = (_func_int **)0x0;
    *(undefined4 *)&pEVar3[1].d = 0;
    *(undefined4 *)&pEVar3[2].d = 0;
    *(undefined4 *)((long)&pEVar3[2].d + 4) = 0;
    *(undefined4 *)&pEVar3[3]._vptr_Extractor = 0;
    *(undefined4 *)((long)&pEVar3[3]._vptr_Extractor + 4) = 0;
    *(undefined4 *)&pEVar3[3].d = 0;
    pEVar3[4]._vptr_Extractor = (_func_int **)0x0;
    pEVar3->d = (ExtractorPrivate *)0x0;
    ncnn::Extractor::~Extractor((Extractor *)this);
    ppvVar2 = &local_158;
    local_70 = ppvVar2;
    local_48 = ppvVar2;
    if (local_150 != (int *)0x0) {
      local_4c = 0xffffffff;
      LOCK();
      local_50 = *local_150;
      *local_150 = *local_150 + -1;
      UNLOCK();
      if (local_50 == 1) {
        if (local_138 == (long *)0x0) {
          if (local_158 != (void *)0x0) {
            free(local_158);
          }
        }
        else {
          (**(code **)(*local_138 + 0x18))(local_138,local_158);
        }
      }
    }
    *ppvVar2 = (void *)0x0;
    ppvVar2[2] = (void *)0x0;
    *(undefined4 *)(ppvVar2 + 3) = 0;
    *(undefined4 *)(ppvVar2 + 5) = 0;
    *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
    *(undefined4 *)(ppvVar2 + 6) = 0;
    *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
    *(undefined4 *)(ppvVar2 + 7) = 0;
    ppvVar2[8] = (void *)0x0;
    ppvVar2[1] = (void *)0x0;
    ncnn::Net::~Net(this);
    return 0;
  }
  exit(-1);
}

Assistant:

static int detect_yolov3(const cv::Mat& bgr, std::vector<Object>& objects)
{
    ncnn::Net yolov3;

    yolov3.opt.use_vulkan_compute = true;

    // original pretrained model from https://github.com/eric612/MobileNet-YOLO
    // param : https://drive.google.com/open?id=1V9oKHP6G6XvXZqhZbzNKL6FI_clRWdC-
    // bin : https://drive.google.com/open?id=1DBcuFCr-856z3FRQznWL_S5h-Aj3RawA
    // the ncnn model https://github.com/nihui/ncnn-assets/tree/master/models
    if (yolov3.load_param("mobilenetv2_yolov3.param"))
        exit(-1);
    if (yolov3.load_model("mobilenetv2_yolov3.bin"))
        exit(-1);

    const int target_size = 352;

    int img_w = bgr.cols;
    int img_h = bgr.rows;

    ncnn::Mat in = ncnn::Mat::from_pixels_resize(bgr.data, ncnn::Mat::PIXEL_BGR, bgr.cols, bgr.rows, target_size, target_size);

    const float mean_vals[3] = {127.5f, 127.5f, 127.5f};
    const float norm_vals[3] = {0.007843f, 0.007843f, 0.007843f};
    in.substract_mean_normalize(mean_vals, norm_vals);

    ncnn::Extractor ex = yolov3.create_extractor();

    ex.input("data", in);

    ncnn::Mat out;
    ex.extract("detection_out", out);

    //     printf("%d %d %d\n", out.w, out.h, out.c);
    objects.clear();
    for (int i = 0; i < out.h; i++)
    {
        const float* values = out.row(i);

        Object object;
        object.label = values[0];
        object.prob = values[1];
        object.rect.x = values[2] * img_w;
        object.rect.y = values[3] * img_h;
        object.rect.width = values[4] * img_w - object.rect.x;
        object.rect.height = values[5] * img_h - object.rect.y;

        objects.push_back(object);
    }

    return 0;
}